

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O1

void * smalloc(small_alloc *alloc,size_t size)

{
  byte bVar1;
  small_mempool *psVar2;
  small_mempool_group *psVar3;
  small_mempool *psVar4;
  mslab *slab;
  rlist *prVar5;
  uint uVar6;
  int iVar7;
  rlist *prVar8;
  size_t *psVar9;
  slab *psVar10;
  slab *psVar11;
  uint uVar12;
  small_mempool *psVar13;
  uint uVar14;
  small_mempool *psVar15;
  small_mempool *psVar16;
  small_mempool *psVar17;
  ulong uVar18;
  small_mempool *psVar19;
  
  psVar19 = (small_mempool *)0x0;
  if (size <= alloc->objsize_max) {
    uVar12 = (alloc->small_class).size_shift_plus_1;
    uVar14 = (uint)size - uVar12;
    if ((uint)size < uVar12) {
      uVar14 = 0;
    }
    uVar14 = uVar14 >> ((byte)(alloc->small_class).ignore_bits_count & 0x1f);
    if ((alloc->small_class).effective_size <= uVar14) {
      bVar1 = (byte)(alloc->small_class).effective_bits;
      uVar12 = uVar14 >> (bVar1 & 0x1f);
      iVar7 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar14 = (uVar14 >> ((byte)iVar7 & 0x1f)) + (iVar7 << (bVar1 & 0x1f));
    }
    psVar19 = alloc->small_mempool_cache + uVar14;
  }
  if (psVar19 == (small_mempool *)0x0) {
    psVar11 = slab_get_large(alloc->cache,size);
    psVar10 = psVar11 + 1;
    if (psVar11 == (slab *)0x0) {
      psVar10 = (slab *)0x0;
    }
  }
  else {
    psVar2 = psVar19->used_pool;
    if ((psVar2->pool).objsize < size) {
      __assert_fail("size <= pool->objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x155,"void *smalloc(struct small_alloc *, size_t)");
    }
    psVar10 = (slab *)mempool_alloc(&psVar2->pool);
    if (psVar10 == (slab *)0x0) {
      if (alloc->small_mempool_cache_size != 0) {
        uVar18 = 0;
        do {
          psVar16 = alloc->small_mempool_cache + uVar18;
          psVar3 = alloc->small_mempool_cache[uVar18].group;
          psVar17 = psVar3->first;
          uVar12 = ((uint)((int)psVar16 - (int)psVar17) >> 3) * 0x1b;
          if (((((psVar3->active_pool_mask >> (uVar12 & 0x1f) & 1) != 0) &&
               ((psVar16->pool).slabs.stats.used < (ulong)(psVar16->pool).objsize)) &&
              (psVar16->waste < psVar3->waste_max >> 2)) &&
             (psVar4 = psVar3->last, psVar4 != psVar16)) {
            uVar12 = psVar3->active_pool_mask & ~(1 << ((byte)uVar12 & 0x1f));
            psVar3->active_pool_mask = uVar12;
            for (psVar13 = psVar17; psVar13 <= psVar4; psVar13 = psVar13 + 1) {
              uVar14 = psVar13->appropriate_pool_mask & uVar12;
              if (uVar14 == 0) goto LAB_00106c54;
              uVar6 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              psVar15 = psVar17 + uVar6;
              psVar13->used_pool = psVar15;
              if (psVar15 < psVar13) goto LAB_00106c73;
              if ((psVar15->pool).objsize < (psVar13->pool).objsize) goto LAB_00106c92;
            }
            slab = (psVar16->pool).spare;
            if (slab != (mslab *)0x0) {
              prVar8 = &(slab->slab).next_in_list;
              prVar5 = (slab->slab).next_in_list.prev;
              prVar5->next = (slab->slab).next_in_list.next;
              ((slab->slab).next_in_list.next)->prev = prVar5;
              (slab->slab).next_in_list.next = prVar8;
              (slab->slab).next_in_list.prev = prVar8;
              psVar9 = &(psVar16->pool).slabs.stats.total;
              *psVar9 = *psVar9 - (slab->slab).size;
              slab_put_with_order((psVar16->pool).cache,&slab->slab);
              (psVar16->pool).spare = (mslab *)0x0;
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < alloc->small_mempool_cache_size);
      }
      psVar10 = (slab *)mempool_alloc(&psVar2->pool);
    }
    if ((psVar10 != (slab *)0x0) && (psVar19->used_pool != psVar19)) {
      uVar18 = (ulong)((psVar19->used_pool->pool).objsize - (psVar19->pool).objsize) +
               psVar19->waste;
      psVar19->waste = uVar18;
      psVar3 = psVar19->group;
      if (psVar3->waste_max <= uVar18) {
        psVar2 = psVar3->first;
        uVar12 = ((uint)((int)psVar19 - (int)psVar2) >> 3) * 0x1b;
        if ((psVar3->active_pool_mask >> (uVar12 & 0x1f) & 1) != 0) {
          __assert_fail("(small_mempool->group->active_pool_mask & (UINT32_C(1) << idx)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0x57,"void small_mempool_activate(struct small_mempool *)");
        }
        uVar12 = 1 << ((byte)uVar12 & 0x1f) | psVar3->active_pool_mask;
        psVar3->active_pool_mask = uVar12;
        psVar19 = psVar3->last;
        for (psVar16 = psVar2; psVar16 <= psVar19; psVar16 = psVar16 + 1) {
          uVar14 = psVar16->appropriate_pool_mask & uVar12;
          if (uVar14 == 0) {
LAB_00106c54:
            __assert_fail("used_idx >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x38,"void small_mempool_update_group(struct small_mempool *)");
          }
          uVar6 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          psVar17 = psVar2 + uVar6;
          psVar16->used_pool = psVar17;
          if (psVar17 < psVar16) {
LAB_00106c73:
            __assert_fail("pool->used_pool >= pool",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x3a,"void small_mempool_update_group(struct small_mempool *)");
          }
          if ((psVar17->pool).objsize < (psVar16->pool).objsize) {
LAB_00106c92:
            __assert_fail("pool->pool.objsize <= pool->used_pool->pool.objsize",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x3b,"void small_mempool_update_group(struct small_mempool *)");
          }
        }
      }
    }
  }
  return psVar10;
}

Assistant:

void *
smalloc(struct small_alloc *alloc, size_t size)
{
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	if (small_mempool == NULL) {
		/* Object is too large, fallback to slab_cache */
		struct slab *slab = slab_get_large(alloc->cache, size);
		if (slab == NULL)
			return NULL;
		return slab_data(slab);
	}
	struct mempool *pool = &small_mempool->used_pool->pool;
	assert(size <= pool->objsize);
	void *ptr = mempool_alloc(pool);
	if (ptr == NULL) {
		/*
		 * In case we run out of memory let's try to deactivate some
		 * pools and release their sparse slabs. It might not help tho.
		 */
		small_mempool_group_sweep_sparse(alloc);
		ptr = mempool_alloc(pool);
	}

	if (ptr != NULL && small_mempool->used_pool != small_mempool) {
		/*
		 * Waste for this allocation is the difference between
		 * the size of objects optimal (i.e. best-fit) mempool and
		 * used mempool.
		 */
		small_mempool->waste +=
			(small_mempool->used_pool->pool.objsize -
			 small_mempool->pool.objsize);
		/*
		 * In case when waste for this mempool becomes greater than
		 * or equal to waste_max, we are updating the information
		 * for the mempool group that this mempool belongs to,
		 * that it can now be used for memory allocation.
		 */
		if (small_mempool->waste >= small_mempool->group->waste_max)
			small_mempool_activate(small_mempool);
	}

	return ptr;
}